

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O0

void __thiscall QSaveFile::QSaveFile(QSaveFile *this,QString *name,QObject *parent)

{
  QFileDevicePrivate *dd;
  QSaveFilePrivate *in_RDI;
  QSaveFilePrivate *d;
  QString *in_stack_ffffffffffffffb8;
  QFileDevice *in_stack_ffffffffffffffd0;
  
  dd = (QFileDevicePrivate *)operator_new(0x1e0);
  QSaveFilePrivate::QSaveFilePrivate(in_RDI);
  QFileDevice::QFileDevice(in_stack_ffffffffffffffd0,dd,(QObject *)in_RDI);
  (in_RDI->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR_metaObject_00be3b88;
  d_func((QSaveFile *)0x2ef9c9);
  QString::operator=((QString *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

QSaveFile::QSaveFile(const QString &name, QObject *parent)
    : QFileDevice(*new QSaveFilePrivate, parent)
{
    Q_D(QSaveFile);
    d->fileName = name;
}